

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterThunkEmitter.cpp
# Opt level: O1

BYTE * __thiscall ThunkBlock::AllocateFromFreeList(ThunkBlock *this)

{
  code *pcVar1;
  bool bVar2;
  BVIndex index;
  undefined4 *puVar3;
  BYTE *pBVar4;
  
  if (this->freeList == (BVFixed *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.cpp"
                       ,0x39b,"(this->freeList)","this->freeList");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  index = BVFixed::GetNextBit(this->freeList,0);
  pBVar4 = ToThunkAddress(this,index);
  BVFixed::Clear(this->freeList,index);
  return pBVar4;
}

Assistant:

BYTE* ThunkBlock::AllocateFromFreeList()
{
    Assert(this->freeList);
    BVIndex index = this->freeList->GetNextBit(0);
    BYTE* address = ToThunkAddress(index);
    this->freeList->Clear(index);
    return address;
}